

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# keyfile.c
# Opt level: O3

econf_err getDoubleValueNum(econf_file key_file,size_t num,double *result)

{
  econf_err eVar1;
  int *piVar2;
  double dVar3;
  char *local_30;
  
  piVar2 = __errno_location();
  *piVar2 = 0;
  dVar3 = strtod(key_file.file_entry[num].value,&local_30);
  *result = dVar3;
  eVar1 = ECONF_VALUE_CONVERSION_ERROR;
  if ((local_30 != key_file.file_entry[num].value) &&
     ((*piVar2 == 0 || ((*piVar2 != 0x22 && ((dVar3 != 0.0 || (NAN(dVar3))))))))) {
    eVar1 = ECONF_SUCCESS;
  }
  return eVar1;
}

Assistant:

econf_err getDoubleValueNum(econf_file key_file, size_t num, double *result) {
  char *endptr;
  errno = 0;
  *result = strtod(key_file.file_entry[num].value, &endptr);
  if (endptr == key_file.file_entry[num].value || errno == ERANGE || (errno != 0 && *result == 0))
    return ECONF_VALUE_CONVERSION_ERROR;
  return ECONF_SUCCESS;
}